

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O3

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::Program,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::Program,_8U> *this,deUintptr newSize)

{
  void **ppvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  void **ppvVar6;
  ulong uVar7;
  ProgramIdentifier *this_00;
  ulong uVar8;
  deUintptr ndx;
  ulong uVar9;
  deUintptr val;
  string local_78;
  string local_58;
  deUintptr local_38;
  
  uVar8 = this->m_numElements;
  uVar9 = newSize;
  if (newSize < uVar8) {
    do {
      vkt::anon_unknown_0::Program::~Program
                ((Program *)
                 ((ulong)(((uint)uVar9 & 0xf) * 0xa0) + (long)this->m_pageTable[uVar9 >> 4]));
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->m_numElements);
    this->m_numElements = newSize;
  }
  else if (uVar8 < newSize) {
    uVar9 = this->m_capacity;
    if (uVar9 <= newSize) {
      uVar7 = newSize + 0xf >> 4;
      if (this->m_pageTableCapacity < uVar7) {
        uVar5 = this->m_pageTableCapacity * 2;
        if (uVar5 <= uVar7) {
          uVar5 = uVar7;
        }
        local_38 = newSize;
        ppvVar1 = (void **)deMemPool_alloc(this->m_pool->m_pool,(long)(uVar5 << 0x23) >> 0x20);
        if (ppvVar1 == (void **)0x0) {
LAB_00384d83:
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = time;
          __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar9 = this->m_pageTableCapacity;
        if (uVar9 != 0) {
          uVar4 = 0;
          do {
            ppvVar1[uVar4] = this->m_pageTable[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
        uVar4 = uVar9 * 8;
        if (uVar9 <= uVar5 && uVar5 - uVar9 != 0) {
          memset(ppvVar1 + uVar9,0,(uVar5 - uVar9) * 8);
        }
        uVar9 = this->m_capacity;
        ppvVar6 = this->m_pageTable;
        this->m_pageTable = ppvVar1;
        this->m_pageTableCapacity = uVar5;
        newSize = local_38;
      }
      else {
        uVar4 = 0;
        ppvVar6 = (void **)0x0;
      }
      uVar9 = uVar9 >> 4;
      pvVar2 = (void *)((long)ppvVar6 + 7U & 0xfffffffffffffff8);
      uVar5 = (long)pvVar2 + (0xa00 - (long)ppvVar6);
      if (uVar5 <= uVar4) {
        do {
          uVar4 = uVar4 - uVar5;
          this->m_pageTable[uVar9] = pvVar2;
          uVar9 = uVar9 + 1;
          pvVar2 = (void *)((long)pvVar2 + 0xa00);
          uVar5 = 0xa00;
        } while (0x9ff < uVar4);
      }
      uVar4 = uVar9;
      if (uVar9 < uVar7) {
        do {
          pvVar2 = deMemPool_alignedAlloc(this->m_pool->m_pool,0xa00,8);
          if (pvVar2 == (void *)0x0) goto LAB_00384d83;
          this->m_pageTable[uVar9] = pvVar2;
          uVar9 = uVar9 + 1;
          uVar4 = uVar7;
        } while (uVar7 != uVar9);
      }
      this->m_capacity = uVar4 << 4;
    }
    this->m_numElements = newSize;
    do {
      this_00 = (ProgramIdentifier *)
                ((ulong)(((uint)uVar8 & 0xf) * 0xa0) + (long)this->m_pageTable[uVar8 >> 4]);
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::vk::BinaryRegistryDetail::ProgramIdentifier::ProgramIdentifier(this_00,&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      *(undefined4 *)&this_00[1].testCasePath._M_dataplus._M_p = 0;
      this_00[1].testCasePath._M_string_length =
           (size_type)((long)&this_00[1].testCasePath.field_2 + 8);
      this_00[1].testCasePath.field_2._M_allocated_capacity = 0;
      this_00[1].testCasePath.field_2._M_local_buf[8] = '\0';
      this_00[1].programName._M_string_length = 0;
      this_00[1].programName.field_2._M_allocated_capacity = 0;
      *(undefined4 *)((long)&this_00[1].programName.field_2 + 8) = 0;
      this_00[2].testCasePath._M_dataplus._M_p = (pointer)&this_00[2].testCasePath.field_2;
      this_00[2].testCasePath._M_string_length = 0;
      this_00[2].testCasePath.field_2._M_local_buf[0] = '\0';
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->m_numElements);
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}